

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvector-generator.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  long lVar1;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> end;
  void *pvVar2;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> begin;
  _Alloc_hider _Var3;
  ulong uVar4;
  pointer pbVar5;
  _Head_base<0UL,_llama_context_*,_false> ctx;
  bool bVar6;
  int iVar7;
  ostream *poVar8;
  size_t sVar9;
  undefined8 uVar10;
  bool skip_empty_lines;
  bool skip_empty_lines_00;
  long lVar11;
  undefined1 with_data;
  ulong uVar12;
  vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> v_diff_filtered;
  tokenized_prompt t;
  vector<tokenized_prompt,_std::allocator<tokenized_prompt>_> tokenized_prompts;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  positive_prompts;
  train_context ctx_train;
  common_init_result llama_init;
  callback_data cb_data;
  char model_hint [128];
  common_params params;
  string local_1640;
  ulong local_1620;
  undefined1 local_1618 [12];
  float fStack_160c;
  undefined1 local_1608 [16];
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_15f8;
  pointer local_15f0;
  ulong local_15e8;
  int local_15dc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_15d8;
  _Head_base<0UL,_llama_context_*,_false> local_15b8;
  undefined1 local_15b0 [32];
  long local_1590;
  long *local_1588 [2];
  long local_1578 [2];
  string local_1568;
  train_context local_1548;
  long *local_14c0 [2];
  long local_14b0 [2];
  string local_14a0;
  common_init_result local_1480;
  callback_data local_1458;
  char local_13f8 [128];
  common_params local_1378;
  
  common_params::common_params(&local_1378);
  std::__cxx11::string::_M_replace
            ((ulong)&local_1378.out_file,0,(char *)local_1378.out_file._M_string_length,0x214130);
  bVar6 = common_params_parse(argc,argv,&local_1378,LLAMA_EXAMPLE_CVECTOR_GENERATOR,print_usage);
  iVar7 = 1;
  if (bVar6) {
    if (local_1378.n_pca_iterations % local_1378.n_pca_batch == 0) {
      local_1378.cb_eval_user_data = &local_1458;
      local_1458.ctx_ggml = (ggml_context *)0x0;
      local_1458.n_layers = 0;
      local_1458.n_tokens = 0;
      local_1458.is_eval_pos = true;
      local_1458.v_pos.super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_1458.v_pos.super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1458.v_pos.super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_1458.v_neg.super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_1458.v_neg.super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1458.v_neg.super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_1458.v_diff_filtered.super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1458.v_diff_filtered.super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1458.v_diff_filtered.super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_1378.cb_eval = cb_eval;
      local_1378.warmup = false;
      fprintf(_stderr,"%s: build = %d (%s)\n","main",(ulong)(uint)LLAMA_BUILD_NUMBER,LLAMA_COMMIT);
      fprintf(_stderr,"%s: built with %s for %s\n","main",LLAMA_COMPILER,LLAMA_BUILD_TARGET);
      llama_backend_init();
      llama_numa_init(local_1378.numa);
      common_init_from_params(&local_1480,&local_1378);
      local_15dc = llama_model_n_layer(local_1480.model._M_t.
                                       super___uniq_ptr_impl<llama_model,_llama_model_deleter>._M_t.
                                       super__Tuple_impl<0UL,_llama_model_*,_llama_model_deleter>.
                                       super__Head_base<0UL,_llama_model_*,_false>._M_head_impl);
      iVar7 = llama_model_n_embd(local_1480.model._M_t.
                                 super___uniq_ptr_impl<llama_model,_llama_model_deleter>._M_t.
                                 super__Tuple_impl<0UL,_llama_model_*,_llama_model_deleter>.
                                 super__Head_base<0UL,_llama_model_*,_false>._M_head_impl);
      llama_model_meta_val_str
                (local_1480.model._M_t.super___uniq_ptr_impl<llama_model,_llama_model_deleter>._M_t.
                 super__Tuple_impl<0UL,_llama_model_*,_llama_model_deleter>.
                 super__Head_base<0UL,_llama_model_*,_false>._M_head_impl,"general.architecture",
                 local_13f8,0x80);
      local_15b8._M_head_impl =
           (llama_context *)
           local_1480.context._M_t.super___uniq_ptr_impl<llama_context,_llama_context_deleter>._M_t.
           super__Tuple_impl<0UL,_llama_context_*,_llama_context_deleter>.
           super__Head_base<0UL,_llama_context_*,_false>._M_head_impl;
      train_context::train_context(&local_1548,iVar7,local_15dc);
      local_1618._0_8_ = local_1608;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1618,local_1378.cvector_positive_file._M_dataplus._M_p,
                 local_1378.cvector_positive_file._M_dataplus._M_p +
                 local_1378.cvector_positive_file._M_string_length);
      ctrlvec_load_prompt_file
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_15b0,(string *)local_1618,skip_empty_lines);
      if ((undefined1 *)local_1618._0_8_ != local_1608) {
        operator_delete((void *)local_1618._0_8_,CONCAT44(local_1608._4_4_,local_1608._0_4_) + 1);
      }
      local_1640._M_dataplus._M_p = (pointer)&local_1640.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1640,local_1378.cvector_negative_file._M_dataplus._M_p,
                 local_1378.cvector_negative_file._M_dataplus._M_p +
                 local_1378.cvector_negative_file._M_string_length);
      ctrlvec_load_prompt_file(&local_15d8,&local_1640,skip_empty_lines_00);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1640._M_dataplus._M_p != &local_1640.field_2) {
        operator_delete(local_1640._M_dataplus._M_p,local_1640.field_2._M_allocated_capacity + 1);
      }
      if (local_15b0._8_8_ - local_15b0._0_8_ ==
          (long)local_15d8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_15d8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start) {
        if (local_15b0._0_8_ == local_15b0._8_8_) {
          main_cold_3();
        }
        else {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=(&local_1548.positive_entries,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_15b0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=(&local_1548.negative_entries,&local_15d8);
        }
      }
      else {
        main_cold_2();
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_15d8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_15b0);
      local_15d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_15d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_15d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (local_1548.positive_entries.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_1548.positive_entries.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        local_1620 = 0;
      }
      else {
        lVar11 = 8;
        local_1620 = 0;
        uVar12 = 0;
        do {
          lVar1 = *(long *)((long)local_1548.positive_entries.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar11 + -8);
          local_1568._M_dataplus._M_p = (pointer)&local_1568.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1568,lVar1,
                     *(long *)((long)&((local_1548.positive_entries.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                      _M_p + lVar11) + lVar1);
          lVar1 = *(long *)((long)local_1548.negative_entries.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar11 + -8);
          local_14a0._M_dataplus._M_p = (pointer)&local_14a0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_14a0,lVar1,
                     *(long *)((long)&((local_1548.negative_entries.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                      _M_p + lVar11) + lVar1);
          tokenized_prompt::tokenized_prompt
                    ((tokenized_prompt *)local_1618,local_15b8._M_head_impl,&local_1568,&local_14a0)
          ;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_14a0._M_dataplus._M_p != &local_14a0.field_2) {
            operator_delete(local_14a0._M_dataplus._M_p,local_14a0.field_2._M_allocated_capacity + 1
                           );
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1568._M_dataplus._M_p != &local_1568.field_2) {
            operator_delete(local_1568._M_dataplus._M_p,local_1568.field_2._M_allocated_capacity + 1
                           );
          }
          uVar4 = local_15e8;
          std::vector<tokenized_prompt,_std::allocator<tokenized_prompt>_>::
          emplace_back<tokenized_prompt>
                    ((vector<tokenized_prompt,_std::allocator<tokenized_prompt>_> *)&local_15d8,
                     (tokenized_prompt *)local_1618);
          pvVar2 = (void *)CONCAT26(local_1608._14_2_,CONCAT15(local_1608[0xd],local_1608._8_5_));
          if (pvVar2 != (void *)0x0) {
            operator_delete(pvVar2,(long)local_15f0 - (long)pvVar2);
          }
          if ((int *)local_1618._0_8_ != (int *)0x0) {
            operator_delete((void *)local_1618._0_8_,
                            CONCAT44(local_1608._4_4_,local_1608._0_4_) - local_1618._0_8_);
          }
          local_1620 = local_1620 + uVar4 * 2;
          uVar12 = uVar12 + 1;
          lVar11 = lVar11 + 0x20;
        } while (uVar12 < (ulong)((long)local_1548.positive_entries.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_1548.positive_entries.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 5));
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"n_total_tokens: ",0x10);
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      ctx._M_head_impl = local_15b8._M_head_impl;
      if (local_1548.positive_entries.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_1548.positive_entries.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        lVar11 = 0x18;
        local_1620 = 0;
        do {
          pbVar5 = local_15d8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)local_1618,
                     (vector<int,_std::allocator<int>_> *)
                     ((long)local_15d8.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + lVar11 + -0x18));
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)(local_1608 + 8),
                     (vector<int,_std::allocator<int>_> *)
                     ((long)&(pbVar5->_M_dataplus)._M_p + lVar11));
          local_15e8 = *(ulong *)((long)&pbVar5->field_2 + lVar11 + 8);
          local_1458.n_tokens = (int)local_15e8;
          local_1458.n_layers = local_15dc;
          uVar12 = (long)local_1548.positive_entries.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_1548.positive_entries.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
          end._M_current._4_4_ = fStack_160c;
          end._M_current._0_4_ = local_1618._8_4_;
          local_1590 = lVar11;
          tokens_to_str<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                    (&local_1640,ctx._M_head_impl,
                     (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
                     local_1618._0_8_,end);
          _Var3._M_p = local_1640._M_dataplus._M_p;
          begin._M_current._5_1_ = local_1608[0xd];
          begin._M_current._0_5_ = local_1608._8_5_;
          begin._M_current._6_2_ = local_1608._14_2_;
          tokens_to_str<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                    ((string *)local_15b0,ctx._M_head_impl,begin,local_15f8);
          local_1620 = local_1620 + 1;
          printf("Evaluating prompt[%d/%d]: \"%s\" - \"%s\" (%d tokens)\n",local_1620,
                 uVar12 >> 5 & 0xffffffff,_Var3._M_p,local_15b0._0_8_,local_15e8 & 0xffffffff);
          if ((pointer)local_15b0._0_8_ != (pointer)(local_15b0 + 0x10)) {
            operator_delete((void *)local_15b0._0_8_,(ulong)(local_15b0._16_8_ + 1));
          }
          lVar11 = local_1590;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1640._M_dataplus._M_p != &local_1640.field_2) {
            operator_delete(local_1640._M_dataplus._M_p,local_1640.field_2._M_allocated_capacity + 1
                           );
          }
          local_1458.is_eval_pos = true;
          bVar6 = get_hidden_layers(ctx._M_head_impl,(vector<int,_std::allocator<int>_> *)local_1618
                                   );
          if (!bVar6) {
LAB_00126b94:
            tokenized_prompt::~tokenized_prompt((tokenized_prompt *)local_1618);
            break;
          }
          local_1458.is_eval_pos = false;
          bVar6 = get_hidden_layers(ctx._M_head_impl,
                                    (vector<int,_std::allocator<int>_> *)(local_1608 + 8));
          if (!bVar6) goto LAB_00126b94;
          callback_data::calc_diff
                    ((vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *)&local_1640,
                     &local_1458);
          train_context::concat_diff_tmp
                    (&local_1548,
                     (vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *)&local_1640);
          callback_data::reset(&local_1458);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1640._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            operator_delete(local_1640._M_dataplus._M_p,
                            local_1640.field_2._M_allocated_capacity -
                            (long)local_1640._M_dataplus._M_p);
          }
          pvVar2 = (void *)CONCAT26(local_1608._14_2_,CONCAT15(local_1608[0xd],local_1608._8_5_));
          if (pvVar2 != (void *)0x0) {
            operator_delete(pvVar2,(long)local_15f0 - (long)pvVar2);
          }
          if ((int *)local_1618._0_8_ != (int *)0x0) {
            operator_delete((void *)local_1618._0_8_,
                            CONCAT44(local_1608._4_4_,local_1608._0_4_) - local_1618._0_8_);
          }
          lVar11 = lVar11 + 0x38;
        } while (local_1620 <
                 (ulong)((long)local_1548.positive_entries.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_1548.positive_entries.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 5));
      }
      puts("Done evaluate prompts, unload model...");
      train_context::build_v_diff(&local_1548,local_1378.cvector_dimre_method == DIMRE_METHOD_PCA);
      if (local_1378.cvector_dimre_method == DIMRE_METHOD_PCA) {
        fStack_160c = 1e-07;
        local_1608._0_4_ = 0;
        local_1608._4_4_ = 0;
        local_1618._0_4_ = local_1378.cpuparams.n_threads;
        local_1618._4_4_ = local_1378.n_pca_batch;
        PCA::run_pca((pca_params *)local_1618,&local_1548.v_diff,&local_1548.v_final);
      }
      else {
        mean::run(&local_1548.v_diff,&local_1548.v_final);
      }
      local_1588[0] = local_1578;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1588,local_1378.out_file._M_dataplus._M_p,
                 (char *)(local_1378.out_file._M_string_length +
                         (long)local_1378.out_file._M_dataplus._M_p));
      local_14c0[0] = local_14b0;
      sVar9 = strlen(local_13f8);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_14c0,local_13f8,local_13f8 + sVar9);
      uVar10 = gguf_init_empty();
      local_1618._0_8_ = local_1608;
      local_1608._0_4_ = 0x746e6f63;
      local_1608._4_4_ = 0x766c6f72;
      local_1608._8_5_ = 0x726f746365;
      local_1618._8_4_ = 0xd;
      fStack_160c = 0.0;
      local_1608[0xd] = '\0';
      gguf_set_val_str(uVar10,"general.architecture");
      local_1640._M_dataplus._M_p = (pointer)&local_1640.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1640,local_1618._0_8_,
                 (pointer)(local_1618._0_8_ + CONCAT44(fStack_160c,local_1618._8_4_)));
      std::__cxx11::string::append((char *)&local_1640);
      gguf_set_val_str(uVar10,local_1640._M_dataplus._M_p,local_14c0[0]);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1640._M_dataplus._M_p != &local_1640.field_2) {
        operator_delete(local_1640._M_dataplus._M_p,local_1640.field_2._M_allocated_capacity + 1);
      }
      local_1640._M_dataplus._M_p = (pointer)&local_1640.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1640,local_1618._0_8_,
                 (pointer)(local_1618._0_8_ + CONCAT44(fStack_160c,local_1618._8_4_)));
      std::__cxx11::string::append((char *)&local_1640);
      gguf_set_val_i32(uVar10,local_1640._M_dataplus._M_p,
                       (ulong)((long)local_1548.v_final.
                                     super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_1548.v_final.
                                    super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 3);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1640._M_dataplus._M_p != &local_1640.field_2) {
        operator_delete(local_1640._M_dataplus._M_p,local_1640.field_2._M_allocated_capacity + 1);
      }
      if (local_1548.v_final.super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          local_1548.v_final.super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        uVar12 = 0;
        do {
          with_data = SUB81(local_1548.v_final.
                            super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar12],0);
          gguf_add_tensor(uVar10);
          print_debug_tensor(local_1548.v_final.
                             super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>.
                             _M_impl.super__Vector_impl_data._M_start[uVar12],(bool)with_data);
          printf("Added tensor: %s\n",
                 local_1548.v_final.
                 super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar12]->name);
          uVar12 = uVar12 + 1;
        } while (uVar12 < (ulong)((long)local_1548.v_final.
                                        super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_1548.v_final.
                                        super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 3));
      }
      printf("%s: writing file...\n","export_gguf");
      gguf_write_to_file(uVar10,local_1588[0],0);
      printf("%s: wrote file \'%s\'\n","export_gguf",local_1588[0]);
      gguf_free(uVar10);
      if ((undefined1 *)local_1618._0_8_ != local_1608) {
        operator_delete((void *)local_1618._0_8_,CONCAT44(local_1608._4_4_,local_1608._0_4_) + 1);
      }
      if (local_14c0[0] != local_14b0) {
        operator_delete(local_14c0[0],local_14b0[0] + 1);
      }
      if (local_1588[0] != local_1578) {
        operator_delete(local_1588[0],local_1578[0] + 1);
      }
      llama_backend_free();
      std::vector<tokenized_prompt,_std::allocator<tokenized_prompt>_>::~vector
                ((vector<tokenized_prompt,_std::allocator<tokenized_prompt>_> *)&local_15d8);
      train_context::~train_context(&local_1548);
      std::
      vector<std::unique_ptr<llama_adapter_lora,_llama_adapter_lora_deleter>,_std::allocator<std::unique_ptr<llama_adapter_lora,_llama_adapter_lora_deleter>_>_>
      ::~vector(&local_1480.lora);
      std::unique_ptr<llama_context,_llama_context_deleter>::~unique_ptr(&local_1480.context);
      std::unique_ptr<llama_model,_llama_model_deleter>::~unique_ptr(&local_1480.model);
      if (local_1458.v_diff_filtered.
          super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1458.v_diff_filtered.
                        super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1458.v_diff_filtered.
                              super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_1458.v_diff_filtered.
                              super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_1458.v_neg.super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1458.v_neg.
                        super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1458.v_neg.
                              super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_1458.v_neg.
                              super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_1458.v_pos.super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1458.v_pos.
                        super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1458.v_pos.
                              super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_1458.v_pos.
                              super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      iVar7 = 0;
    }
    else {
      main_cold_1();
    }
  }
  common_params::~common_params(&local_1378);
  return iVar7;
}

Assistant:

int main(int argc, char ** argv) {
    common_params params;

    params.out_file = "control_vector.gguf";

    if (!common_params_parse(argc, argv, params, LLAMA_EXAMPLE_CVECTOR_GENERATOR, print_usage)) {
        return 1;
    }

    if (params.n_pca_iterations % params.n_pca_batch != 0) {
        fprintf(stderr, "PCA iterations must by multiply of PCA batch size\n");
        return 1;
    }


    callback_data cb_data;

    // pass the callback to the backend scheduler
    // it will be executed for each node during the graph computation
    params.cb_eval = cb_eval;
    params.cb_eval_user_data = &cb_data;
    params.warmup = false;

    print_build_info();
    llama_backend_init();
    llama_numa_init(params.numa);

    // load the model to get hparams
    common_init_result llama_init = common_init_from_params(params);

    llama_model * model = llama_init.model.get();
    llama_context * ctx = llama_init.context.get();

    // int n_ctx = llama_n_ctx(ctx);
    int n_layers = llama_model_n_layer(model);
    int n_embd = llama_model_n_embd(model);

    // get model hint param (a.k.a model arch name)
    char model_hint[128];
    llama_model_meta_val_str(model, "general.architecture", model_hint, 128);

    // init train_context
    train_context ctx_train(n_embd, n_layers);

    // load and prepare entries for training
    prepare_entries(params, ctx_train);

    // we have to pretokenize everything because otherwise we don't know how much overhead to allocate ctx_diffs_wrapped
    std::vector<tokenized_prompt> tokenized_prompts;
    size_t n_total_tokens = 0;
    for (size_t i = 0; i < ctx_train.positive_entries.size(); ++i) {
        tokenized_prompt t(ctx, ctx_train.positive_entries[i], ctx_train.negative_entries[i]);
        n_total_tokens += 2 * t.max_seq_len;
        tokenized_prompts.push_back(std::move(t));
    }

    std::cout << "n_total_tokens: " << n_total_tokens << std::endl;

    for(size_t i = 0; i < ctx_train.positive_entries.size(); ++i) {
        bool success = false;
        tokenized_prompt t = tokenized_prompts[i];
        cb_data.n_layers = n_layers;
        cb_data.n_tokens = t.max_seq_len;

        printf("Evaluating prompt[%d/%d]: \"%s\" - \"%s\" (%d tokens)\n",
            (int) i+1, (int) ctx_train.positive_entries.size(),
            tokens_to_str(ctx, t.tokens_pos.cbegin(), t.tokens_pos.cend()).c_str(),
            tokens_to_str(ctx, t.tokens_neg.cbegin(), t.tokens_neg.cend()).c_str(),
            (int) t.max_seq_len);

        cb_data.is_eval_pos = true;
        success = get_hidden_layers(ctx, t.tokens_pos);
        if (!success) break;

        cb_data.is_eval_pos = false;
        success = get_hidden_layers(ctx, t.tokens_neg);
        if (!success) break;

        // calculate diff and remove all zero rows
        auto v_diff_filtered = cb_data.calc_diff();

        // save & concat the filtered v_diff to ctx_train
        ctx_train.concat_diff_tmp(v_diff_filtered);

        // reset for next iteration
        cb_data.reset();
    }

    // done with the model, we can now free it to make gain some memory
    printf("Done evaluate prompts, unload model...\n");

    bool use_pca = params.cvector_dimre_method == DIMRE_METHOD_PCA;

    // prepare ctx_train for PCA
    ctx_train.build_v_diff(use_pca);

    if (use_pca) {
        // run PCA
        PCA::pca_params pca_params;
        pca_params.n_threads    = params.cpuparams.n_threads;
        pca_params.n_batch      = params.n_pca_batch;
        pca_params.n_iterations = params.n_pca_iterations;
        PCA::run_pca(pca_params, ctx_train.v_diff, ctx_train.v_final);
    } else {
        // run mean
        mean::run(ctx_train.v_diff, ctx_train.v_final);
    }

    // write output vectors to gguf
    export_gguf(ctx_train.v_final, params.out_file, model_hint);

    llama_backend_free();

    return 0;
}